

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> * __thiscall
el::base::TypedConfigurations::unsafeGetConfigByRef<std::shared_ptr<std::fstream>>
          (TypedConfigurations *this,Level level,
          unordered_map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
          *confMap,char *confName)

{
  __node_base_ptr p_Var1;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *psVar2;
  key_type local_10;
  Level local_c;
  
  local_c = level;
  p_Var1 = utils::std::
           _Hashtable<el::Level,_std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&confMap->_M_h,(ulong)level % (confMap->_M_h)._M_bucket_count,&local_c,
                      (ulong)level);
  if ((p_Var1 == (__node_base_ptr)0x0) || (p_Var1->_M_nxt == (_Hash_node_base *)0x0)) {
    local_10 = Global;
    psVar2 = utils::std::__detail::
             _Map_base<el::Level,_std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<el::Level,_std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)confMap,&local_10);
  }
  else {
    psVar2 = (shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)(p_Var1->_M_nxt + 2);
  }
  return psVar2;
}

Assistant:

Conf_T& unsafeGetConfigByRef(Level level, std::unordered_map<Level, Conf_T>* confMap, const char* confName) {
    ELPP_UNUSED(confName);
    typename std::unordered_map<Level, Conf_T>::iterator it = confMap->find(level);
    if (it == confMap->end()) {
      try {
        return confMap->at(Level::Global);
      } catch (...) {
        ELPP_INTERNAL_ERROR("Unable to get configuration [" << confName << "] for level ["
                            << LevelHelper::convertToString(level) << "]"
                            << std::endl << "Please ensure you have properly configured logger.", false);
      }
    }
    return it->second;
  }